

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TraceStats_BufferStats::~TraceStats_BufferStats(TraceStats_BufferStats *this)

{
  TraceStats_BufferStats *this_local;
  
  ~TraceStats_BufferStats(this);
  operator_delete(this,200);
  return;
}

Assistant:

TraceStats_BufferStats::~TraceStats_BufferStats() = default;